

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O2

void __thiscall cmComputeLinkDepends::DisplayComponents(cmComputeLinkDepends *this)

{
  cmComputeComponentGraph *pcVar1;
  pointer pcVar2;
  int *piVar3;
  pointer pcVar4;
  pointer pcVar5;
  uint uVar6;
  ulong uVar7;
  cmGraphEdge *oi;
  int *piVar8;
  pointer pcVar9;
  
  fwrite("The strongly connected components are:\n",0x27,1,_stderr);
  pcVar1 = this->CCG;
  uVar6 = 0;
  while( true ) {
    uVar7 = (ulong)uVar6;
    if ((ulong)(((long)(pcVar1->Components).
                       super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>._M_impl
                       .super__Vector_impl_data._M_finish -
                (long)(pcVar1->Components).
                      super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>._M_impl.
                      super__Vector_impl_data._M_start) / 0x18) <= uVar7) break;
    fprintf(_stderr,"Component (%u):\n",uVar7);
    pcVar2 = (pcVar1->Components).
             super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar3 = *(pointer *)
              ((long)&pcVar2[uVar7].super_vector<int,_std::allocator<int>_>.
                      super__Vector_base<int,_std::allocator<int>_>._M_impl + 8);
    for (piVar8 = *(int **)&pcVar2[uVar7].super_vector<int,_std::allocator<int>_>.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl; piVar8 != piVar3;
        piVar8 = piVar8 + 1) {
      fprintf(_stderr,"  item %d [%s]\n",(long)*piVar8,
              (this->EntryList).
              super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
              ._M_impl.super__Vector_impl_data._M_start[*piVar8].Item._M_dataplus._M_p);
    }
    pcVar4 = (this->CCG->ComponentGraph).
             super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
             super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
             super__Vector_impl_data._M_start;
    pcVar5 = *(pointer *)
              ((long)&pcVar4[(int)uVar6].super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>.
                      super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_> + 8);
    for (pcVar9 = *(pointer *)
                   &pcVar4[(int)uVar6].super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>.
                    super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_>; pcVar9 != pcVar5;
        pcVar9 = pcVar9 + 1) {
      fprintf(_stderr,"  followed by Component (%d)\n",(ulong)(uint)pcVar9->Dest);
    }
    fprintf(_stderr,"  topo order index %d\n",
            (ulong)(uint)(this->ComponentOrder).super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl.super__Vector_impl_data._M_start[uVar7]);
    uVar6 = uVar6 + 1;
  }
  fputc(10,_stderr);
  return;
}

Assistant:

void cmComputeLinkDepends::DisplayComponents()
{
  fprintf(stderr, "The strongly connected components are:\n");
  std::vector<NodeList> const& components = this->CCG->GetComponents();
  for (unsigned int c = 0; c < components.size(); ++c) {
    fprintf(stderr, "Component (%u):\n", c);
    NodeList const& nl = components[c];
    for (int i : nl) {
      fprintf(stderr, "  item %d [%s]\n", i, this->EntryList[i].Item.c_str());
    }
    EdgeList const& ol = this->CCG->GetComponentGraphEdges(c);
    for (cmGraphEdge const& oi : ol) {
      int i = oi;
      fprintf(stderr, "  followed by Component (%d)\n", i);
    }
    fprintf(stderr, "  topo order index %d\n", this->ComponentOrder[c]);
  }
  fprintf(stderr, "\n");
}